

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O3

FT_Error afm_parser_parse(AFM_Parser parser)

{
  AFM_FontInfo pAVar1;
  FT_Memory memory;
  AFM_Stream pAVar2;
  AFM_FontInfo pAVar3;
  bool bVar4;
  int iVar5;
  AFM_Token AVar6;
  FT_Int FVar7;
  uint uVar8;
  char *pcVar9;
  AFM_KernPair pAVar10;
  ulong uVar11;
  AFM_TrackKern pAVar12;
  FT_Offset *pFVar13;
  FT_Offset *in_RDX;
  FT_Offset *len_00;
  FT_Offset *len_01;
  FT_Offset *extraout_RDX;
  FT_Offset *extraout_RDX_00;
  FT_Offset *extraout_RDX_01;
  FT_Offset *extraout_RDX_02;
  FT_Offset *extraout_RDX_03;
  FT_Offset *extraout_RDX_04;
  FT_Offset *extraout_RDX_05;
  FT_Offset *extraout_RDX_06;
  FT_Offset *extraout_RDX_07;
  FT_Offset *pFVar14;
  FT_Offset *extraout_RDX_08;
  FT_Offset *extraout_RDX_09;
  FT_Offset *extraout_RDX_10;
  FT_Offset *extraout_RDX_11;
  FT_Offset *extraout_RDX_12;
  FT_Offset *extraout_RDX_13;
  AFM_ValueType_ AVar15;
  AFM_ValueType_ AVar16;
  FT_Offset len_2;
  FT_Offset len;
  FT_Offset len_1;
  AFM_ValueRec shared_vals [4];
  FT_Offset local_f0;
  int local_e4;
  FT_Offset local_e0;
  AFM_ValueRec_ local_d8;
  undefined4 local_c8;
  FT_UInt local_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  uint local_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  uint local_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  FT_Fixed local_90;
  FT_Offset local_80;
  AFM_ValueRec_ local_78;
  undefined4 local_68;
  FT_Pos local_60;
  undefined4 local_58;
  FT_Pos local_50;
  undefined4 local_48;
  FT_Pos local_40;
  
  pAVar1 = parser->FontInfo;
  if (pAVar1 == (AFM_FontInfo)0x0) {
    AVar15 = AFM_VALUE_TYPE_BOOL|AFM_VALUE_TYPE_FIXED;
  }
  else {
    memory = parser->memory;
    pcVar9 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_e0,in_RDX);
    AVar15 = AFM_VALUE_TYPE_FIXED;
    if (((pcVar9 != (char *)0x0) && (local_e0 == 0x10)) &&
       (iVar5 = strncmp(pcVar9,"StartFontMetrics",0x10), iVar5 == 0)) {
      pcVar9 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_e0,len_00);
      AVar15 = 0xa0;
      if (pcVar9 != (char *)0x0) {
        do {
          AVar6 = afm_tokenize(pcVar9,local_e0);
          pFVar13 = len_01;
          if ((int)AVar6 < 0x1e) {
            if ((int)AVar6 < 0x14) {
              if (AVar6 == AFM_TOKEN_ASCENDER) {
                local_78.type = AFM_VALUE_TYPE_FIXED;
                FVar7 = afm_parser_read_vals(parser,&local_78,1);
                if (FVar7 != 1) break;
                pAVar1->Ascender = CONCAT71(local_78.u.f._1_7_,local_78.u.b);
                pFVar13 = extraout_RDX_05;
              }
              else if (AVar6 == AFM_TOKEN_DESCENDER) {
                local_78.type = AFM_VALUE_TYPE_FIXED;
                FVar7 = afm_parser_read_vals(parser,&local_78,1);
                if (FVar7 != 1) break;
                pAVar1->Descender = CONCAT71(local_78.u.f._1_7_,local_78.u.b);
                pFVar13 = extraout_RDX;
              }
            }
            else if (AVar6 == AFM_TOKEN_FONTBBOX) {
              local_78.type = AFM_VALUE_TYPE_FIXED;
              local_68 = 2;
              local_58 = 2;
              local_48 = 2;
              FVar7 = afm_parser_read_vals(parser,&local_78,4);
              if (FVar7 != 4) break;
              (pAVar1->FontBBox).xMin = CONCAT71(local_78.u.f._1_7_,local_78.u.b);
              (pAVar1->FontBBox).yMin = local_60;
              (pAVar1->FontBBox).xMax = local_50;
              (pAVar1->FontBBox).yMax = local_40;
              pFVar13 = extraout_RDX_01;
            }
            else if (AVar6 == AFM_TOKEN_ENDFONTMETRICS) {
              return 0;
            }
          }
          else if ((int)AVar6 < 0x2d) {
            if (AVar6 == AFM_TOKEN_ISCIDFONT) {
              local_78.type = AFM_VALUE_TYPE_BOOL;
              FVar7 = afm_parser_read_vals(parser,&local_78,1);
              if (FVar7 != 1) break;
              pAVar1->IsCIDFont = local_78.u.b;
              pFVar13 = extraout_RDX_06;
            }
            else if (AVar6 == AFM_TOKEN_METRICSSETS) {
              local_d8.type = AFM_VALUE_TYPE_INTEGER;
              FVar7 = afm_parser_read_vals(parser,&local_d8,1);
              if (FVar7 != 1) break;
              pFVar13 = extraout_RDX_00;
              if ((local_d8.u.u & 0xfffffffd) != 0) {
                AVar15 = AFM_VALUE_TYPE_BOOL|AFM_VALUE_TYPE_INTEGER;
                break;
              }
            }
          }
          else if (AVar6 == AFM_TOKEN_STARTCHARMETRICS) {
            local_d8.type = AFM_VALUE_TYPE_INTEGER;
            FVar7 = afm_parser_read_vals(parser,&local_d8,1);
            if (FVar7 != 1) break;
            iVar5 = local_d8.u.i + 1;
            pFVar13 = extraout_RDX_02;
            while (iVar5 = iVar5 + -1, 0 < iVar5) {
              pcVar9 = afm_parser_next_key((AFM_Parser)parser->stream,'\0',pFVar13);
              pFVar13 = extraout_RDX_03;
              if (pcVar9 == (char *)0x0) {
                return 0xa0;
              }
            }
            do {
              pcVar9 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_d8,pFVar13);
              if (pcVar9 == (char *)0x0) {
                return 0xa0;
              }
              AVar6 = afm_tokenize(pcVar9,CONCAT44(local_d8._4_4_,local_d8.type));
            } while ((AVar6 != AFM_TOKEN_ENDCHARMETRICS) &&
                    (pFVar13 = extraout_RDX_04, AVar6 != AFM_TOKEN_ENDFONTMETRICS));
            AVar15 = AFM_VALUE_TYPE_STRING;
            pFVar13 = extraout_RDX_04;
          }
          else if (AVar6 == AFM_TOKEN_STARTKERNDATA) {
            pcVar9 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_80,len_01);
            AVar16 = 0xa0;
            AVar15 = AVar16;
            if (pcVar9 != (char *)0x0) {
              bVar4 = false;
              local_e4 = 0;
              goto LAB_0022e93e;
            }
            break;
          }
          pcVar9 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_e0,pFVar13);
        } while (pcVar9 != (char *)0x0);
      }
LAB_0022e8c7:
      ft_mem_free(memory,pAVar1->TrackKerns);
      pAVar1->TrackKerns = (AFM_TrackKern)0x0;
      pAVar1->NumTrackKern = 0;
      ft_mem_free(memory,pAVar1->KernPairs);
      pAVar1->KernPairs = (AFM_KernPair)0x0;
      pAVar1->NumKernPair = 0;
      pAVar1->IsCIDFont = '\0';
    }
  }
  return AVar15;
LAB_0022e93e:
  AVar6 = afm_tokenize(pcVar9,local_80);
  if ((int)AVar6 < 0x35) {
    if (1 < AVar6 - AFM_TOKEN_STARTKERNPAIRS) {
      AVar15 = AVar16;
      if (AVar6 - AFM_TOKEN_ENDFONTMETRICS < 2) {
        return 0;
      }
      goto LAB_0022e8c7;
    }
    AVar15 = AVar16;
    if (bVar4) goto LAB_0022e8c7;
    pAVar2 = parser->stream;
    pAVar3 = parser->FontInfo;
    local_d8.type = AFM_VALUE_TYPE_INTEGER;
    FVar7 = afm_parser_read_vals(parser,&local_d8,1);
    if ((FVar7 == 1) && (pFVar13 = (FT_Offset *)(long)local_d8.u.i, -1 < (long)pFVar13)) {
      pAVar3->NumKernPair = local_d8.u.i;
      pFVar14 = (FT_Offset *)((ulong)((long)pAVar2->limit - (long)pAVar2->cursor) / 10);
      if (pFVar13 <= pFVar14) {
        if (local_d8.u.i != 0) {
          pAVar10 = (AFM_KernPair)
                    ft_mem_qrealloc(parser->memory,0x10,0,(FT_Long)pFVar13,(void *)0x0,
                                    (FT_Error *)&local_d8);
          pAVar3->KernPairs = pAVar10;
          pFVar14 = extraout_RDX_08;
          AVar15 = local_d8.type;
          if (local_d8.type != AFM_VALUE_TYPE_STRING) goto LAB_0022e8c7;
        }
        pcVar9 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_f0,pFVar14);
        if (pcVar9 != (char *)0x0) {
          iVar5 = -1;
          do {
            AVar6 = afm_tokenize(pcVar9,local_f0);
            uVar11 = (ulong)(AVar6 - AFM_TOKEN_ENDFONTMETRICS);
            if (0x37 < AVar6 - AFM_TOKEN_ENDFONTMETRICS) break;
            if ((0x34000UL >> (uVar11 & 0x3f) & 1) == 0) {
              pFVar13 = extraout_RDX_09;
              if (uVar11 != 0x37) goto LAB_0022ecbf;
            }
            else {
              iVar5 = iVar5 + 1;
              if ((int)pAVar3->NumKernPair <= iVar5) break;
              pAVar10 = pAVar3->KernPairs + iVar5;
              local_d8.type = AFM_VALUE_TYPE_INDEX;
              local_c8 = 5;
              local_b8 = 3;
              local_a8 = 3;
              FVar7 = afm_parser_read_vals(parser,&local_d8,4);
              if (FVar7 < 3) break;
              pAVar10->index1 = local_d8.u.i;
              pAVar10->index2 = local_c0;
              pFVar13 = (FT_Offset *)0x0;
              uVar8 = local_b0;
              if (AVar6 != AFM_TOKEN_KPY) {
                uVar8 = 0;
                if (FVar7 == 4 && AVar6 == AFM_TOKEN_KP) {
                  uVar8 = local_a0;
                }
                pFVar13 = (FT_Offset *)(ulong)local_b0;
              }
              pAVar10->x = (FT_Int)pFVar13;
              pAVar10->y = uVar8;
            }
            pcVar9 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_f0,pFVar13);
            if (pcVar9 == (char *)0x0) break;
          } while( true );
        }
      }
    }
  }
  else {
    pFVar13 = extraout_RDX_07;
    if (AVar6 == AFM_TOKEN_UNKNOWN) goto LAB_0022ed31;
    AVar15 = AVar16;
    if ((AVar6 != AFM_TOKEN_STARTTRACKKERN) || (local_e4 != 0)) goto LAB_0022e8c7;
    pAVar2 = parser->stream;
    pAVar3 = parser->FontInfo;
    local_d8.type = AFM_VALUE_TYPE_INTEGER;
    FVar7 = afm_parser_read_vals(parser,&local_d8,1);
    if ((FVar7 == 1) && (pFVar13 = (FT_Offset *)(long)local_d8.u.i, -1 < (long)pFVar13)) {
      pAVar3->NumTrackKern = local_d8.u.i;
      pFVar14 = (FT_Offset *)((ulong)((long)pAVar2->limit - (long)pAVar2->cursor) / 0x14);
      if (pFVar14 < pFVar13) goto LAB_0022ed5a;
      if (local_d8.u.i != 0) {
        pAVar12 = (AFM_TrackKern)
                  ft_mem_qrealloc(parser->memory,0x28,0,(FT_Long)pFVar13,(void *)0x0,
                                  (FT_Error *)&local_d8);
        pAVar3->TrackKerns = pAVar12;
        pFVar14 = extraout_RDX_10;
        AVar15 = local_d8.type;
        if (local_d8.type != AFM_VALUE_TYPE_STRING) goto LAB_0022e8c7;
      }
      pcVar9 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_f0,pFVar14);
      if (pcVar9 != (char *)0x0) {
        iVar5 = -1;
        do {
          AVar6 = afm_tokenize(pcVar9,local_f0);
          if ((int)AVar6 < 0x4b) {
            if (AVar6 != AFM_TOKEN_TRACKKERN) goto LAB_0022ed05;
            iVar5 = iVar5 + 1;
            if ((int)pAVar3->NumTrackKern <= iVar5) break;
            pAVar12 = pAVar3->TrackKerns;
            local_d8.type = AFM_VALUE_TYPE_INTEGER;
            local_c8 = 2;
            local_b8 = 2;
            local_a8 = 2;
            local_98 = 2;
            FVar7 = afm_parser_read_vals(parser,&local_d8,5);
            if (FVar7 != 5) break;
            pAVar12[iVar5].degree = local_d8.u.i;
            pAVar12[iVar5].min_ptsize = CONCAT44(uStack_bc,local_c0);
            pAVar12[iVar5].min_kern = CONCAT44(uStack_ac,local_b0);
            pAVar12[iVar5].max_ptsize = CONCAT44(uStack_9c,local_a0);
            pAVar12[iVar5].max_kern = local_90;
            pFVar13 = extraout_RDX_12;
          }
          else {
            pFVar13 = extraout_RDX_11;
            if (AVar6 != AFM_TOKEN_UNKNOWN) break;
          }
          pcVar9 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_f0,pFVar13);
          if (pcVar9 == (char *)0x0) break;
        } while( true );
      }
    }
  }
LAB_0022ed5a:
  AVar15 = 0xa0;
  goto LAB_0022e8c7;
LAB_0022ed05:
  if ((AVar6 - AFM_TOKEN_ENDFONTMETRICS < 2) || (AVar6 == AFM_TOKEN_ENDTRACKKERN)) {
    if (iVar5 + 1U != pAVar3->NumTrackKern) {
      pAVar3->NumTrackKern = iVar5 + 1U;
    }
    local_e4 = 1;
    pFVar13 = extraout_RDX_11;
    goto LAB_0022ed31;
  }
  goto LAB_0022ed5a;
LAB_0022ecbf:
  AVar15 = 0xa0;
  if ((7UL >> (uVar11 & 0x3f) & 1) == 0) goto LAB_0022e8c7;
  uVar8 = iVar5 + 1;
  if (uVar8 != pAVar3->NumKernPair) {
    pAVar3->NumKernPair = uVar8;
  }
  qsort(pAVar3->KernPairs,(ulong)uVar8,0x10,afm_compare_kern_pairs);
  bVar4 = true;
  pFVar13 = extraout_RDX_13;
LAB_0022ed31:
  pcVar9 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_80,pFVar13);
  AVar15 = AVar16;
  if (pcVar9 == (char *)0x0) goto LAB_0022e8c7;
  goto LAB_0022e93e;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  afm_parser_parse( AFM_Parser  parser )
  {
    FT_Memory     memory = parser->memory;
    AFM_FontInfo  fi     = parser->FontInfo;
    FT_Error      error  = FT_ERR( Syntax_Error );
    char*         key;
    FT_Offset     len;
    FT_Int        metrics_sets = 0;


    if ( !fi )
      return FT_THROW( Invalid_Argument );

    key = afm_parser_next_key( parser, 1, &len );
    if ( !key || len != 16                              ||
         ft_strncmp( key, "StartFontMetrics", 16 ) != 0 )
      return FT_THROW( Unknown_File_Format );

    while ( ( key = afm_parser_next_key( parser, 1, &len ) ) != 0 )
    {
      AFM_ValueRec  shared_vals[4];


      switch ( afm_tokenize( key, len ) )
      {
      case AFM_TOKEN_METRICSSETS:
        if ( afm_parser_read_int( parser, &metrics_sets ) )
          goto Fail;

        if ( metrics_sets != 0 && metrics_sets != 2 )
        {
          error = FT_THROW( Unimplemented_Feature );

          goto Fail;
        }
        break;

      case AFM_TOKEN_ISCIDFONT:
        shared_vals[0].type = AFM_VALUE_TYPE_BOOL;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->IsCIDFont = shared_vals[0].u.b;
        break;

      case AFM_TOKEN_FONTBBOX:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[1].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[2].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[3].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 4 ) != 4 )
          goto Fail;

        fi->FontBBox.xMin = shared_vals[0].u.f;
        fi->FontBBox.yMin = shared_vals[1].u.f;
        fi->FontBBox.xMax = shared_vals[2].u.f;
        fi->FontBBox.yMax = shared_vals[3].u.f;
        break;

      case AFM_TOKEN_ASCENDER:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->Ascender = shared_vals[0].u.f;
        break;

      case AFM_TOKEN_DESCENDER:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->Descender = shared_vals[0].u.f;
        break;

      case AFM_TOKEN_STARTCHARMETRICS:
        {
          FT_Int  n = 0;


          if ( afm_parser_read_int( parser, &n ) )
            goto Fail;

          error = afm_parser_skip_section( parser, n,
                                           AFM_TOKEN_ENDCHARMETRICS );
          if ( error )
            return error;
        }
        break;

      case AFM_TOKEN_STARTKERNDATA:
        error = afm_parse_kern_data( parser );
        if ( error )
          goto Fail;
        /* we only support kern data, so ... */
        FALL_THROUGH;

      case AFM_TOKEN_ENDFONTMETRICS:
        return FT_Err_Ok;

      default:
        break;
      }
    }

  Fail:
    FT_FREE( fi->TrackKerns );
    fi->NumTrackKern = 0;

    FT_FREE( fi->KernPairs );
    fi->NumKernPair = 0;

    fi->IsCIDFont = 0;

    return error;
  }